

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_decompressMultiFrame
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_DDict *ddict)

{
  ZSTD_format_e format;
  unsigned_long_long uVar1;
  size_t sVar2;
  ulong uVar3;
  byte *pbVar4;
  XXH64_hash_t XVar5;
  byte *pbVar6;
  size_t sVar7;
  byte *src_00;
  byte *dst_00;
  bool bVar8;
  bool bVar9;
  size_t sStackY_a0;
  byte *local_80;
  blockProperties_t local_3c;
  
  if (ddict != (ZSTD_DDict *)0x0 && dict != (void *)0x0) {
    __assert_fail("dict==NULL || ddict==NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x9f73,
                  "size_t ZSTD_decompressMultiFrame(ZSTD_DCtx *, void *, size_t, const void *, size_t, const void *, size_t, const ZSTD_DDict *)"
                 );
  }
  if (ddict != (ZSTD_DDict *)0x0) {
    dict = ddict->dictContent;
    dictSize = ddict->dictSize;
  }
  bVar9 = false;
  local_80 = (byte *)dst;
  while( true ) {
    while( true ) {
      sVar7 = 0xffffffffffffffb8;
      sVar2 = ZSTD_startingInputLength(dctx->format);
      if (srcSize < sVar2) {
        if (srcSize == 0) {
          sVar7 = (long)local_80 - (long)dst;
        }
        return sVar7;
      }
      if ((srcSize < 4) || ((*src & 0xfffffff0) != 0x184d2a50)) break;
      if (srcSize < 8) {
        return 0xffffffffffffffb8;
      }
      if (0x1ffffffe < *(uint *)((long)src + 4) >> 3) {
        return 0xfffffffffffffff2;
      }
      uVar3 = (ulong)*(uint *)((long)src + 4) + 8;
      bVar8 = srcSize < uVar3;
      srcSize = srcSize - uVar3;
      if (bVar8) {
        return 0xffffffffffffffb8;
      }
      src = (void *)((long)src + uVar3);
    }
    if (ddict == (ZSTD_DDict *)0x0) {
      sVar2 = ZSTD_decompressBegin_usingDict(dctx,dict,dictSize);
      if (0xffffffffffffff88 < sVar2) {
        return sVar2;
      }
    }
    else {
      ZSTD_decompressBegin_usingDDict(dctx,ddict);
    }
    ZSTD_checkContinuity(dctx,local_80,dstCapacity);
    format = dctx->format;
    if (srcSize < (ulong)(format == ZSTD_f_zstd1) * 4 + 5) {
      return 0xffffffffffffffb8;
    }
    sVar2 = ZSTD_frameHeaderSize_internal(src,(ulong)(format == ZSTD_f_zstd1) * 4 + 1,format);
    sStackY_a0 = sVar2;
    if (0xffffffffffffff88 < sVar2) break;
    if (srcSize < sVar2 + 3) {
      return 0xffffffffffffffb8;
    }
    sStackY_a0 = ZSTD_decodeFrameHeader(dctx,src,sVar2);
    if (0xffffffffffffff88 < sStackY_a0) break;
    pbVar4 = local_80 + dstCapacity;
    src = (void *)((long)src + sVar2);
    srcSize = srcSize - sVar2;
    dst_00 = local_80;
    do {
      sVar2 = ZSTD_getcBlockSize(src,srcSize,&local_3c);
      sStackY_a0 = sVar2;
      if (0xffffffffffffff88 < sVar2) goto LAB_0016f6cf;
      uVar3 = srcSize - 3;
      srcSize = uVar3 - sVar2;
      if (uVar3 < sVar2) {
        sStackY_a0 = 0xffffffffffffffb8;
        goto LAB_0016f6cf;
      }
      src_00 = (byte *)((long)src + 3);
      pbVar6 = pbVar4;
      if (src_00 < pbVar4) {
        pbVar6 = src_00;
      }
      if (src_00 < dst_00) {
        pbVar6 = pbVar4;
      }
      if (local_3c.blockType == bt_compressed) {
        sStackY_a0 = ZSTD_decompressBlock_internal
                               (dctx,dst_00,(long)pbVar6 - (long)dst_00,src_00,sVar2,1,not_streaming
                               );
        if (0xffffffffffffff88 < sStackY_a0) goto LAB_0016f6cf;
      }
      else if (local_3c.blockType == bt_rle) {
        sStackY_a0 = (size_t)local_3c.origSize;
        if ((ulong)((long)pbVar6 - (long)dst_00) < sStackY_a0) {
LAB_0016f6c0:
          sStackY_a0 = 0xffffffffffffffba;
          goto LAB_0016f6cf;
        }
        if (dst_00 == (byte *)0x0) {
joined_r0x0016f5c1:
          if (sStackY_a0 != 0) {
            sStackY_a0 = 0xffffffffffffffb6;
            goto LAB_0016f6cf;
          }
          sStackY_a0 = 0;
        }
        else {
          memset(dst_00,(uint)*src_00,sStackY_a0);
        }
      }
      else {
        if (local_3c.blockType != bt_raw) {
          sStackY_a0 = 0xffffffffffffffec;
          goto LAB_0016f6cf;
        }
        if ((ulong)((long)pbVar4 - (long)dst_00) < sVar2) goto LAB_0016f6c0;
        if (dst_00 == (byte *)0x0) goto joined_r0x0016f5c1;
        memmove(dst_00,src_00,sVar2);
      }
      if (dctx->validateChecksum != 0) {
        XXH_INLINE_XXH64_update(&dctx->xxhState,dst_00,sStackY_a0);
      }
      dst_00 = dst_00 + sStackY_a0;
      src = src_00 + sVar2;
    } while (local_3c.lastBlock == 0);
    uVar1 = (dctx->fParams).frameContentSize;
    sStackY_a0 = (long)dst_00 - (long)local_80;
    if ((uVar1 != 0xffffffffffffffff) && (sStackY_a0 != uVar1)) {
      return 0xffffffffffffffec;
    }
    if ((dctx->fParams).checksumFlag != 0) {
      if ((srcSize < 4) ||
         ((dctx->forceIgnoreChecksum == ZSTD_d_validateChecksum &&
          (XVar5 = XXH_INLINE_XXH64_digest(&dctx->xxhState), *src != (uint)XVar5)))) {
        return 0xffffffffffffffea;
      }
      src = (void *)((long)src + 4);
      srcSize = srcSize - 4;
    }
    if (0xffffffffffffff88 < sStackY_a0) break;
    bVar9 = dstCapacity < sStackY_a0;
    dstCapacity = dstCapacity - sStackY_a0;
    if (bVar9) {
      __assert_fail("res <= dstCapacity",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x9fb8,
                    "size_t ZSTD_decompressMultiFrame(ZSTD_DCtx *, void *, size_t, const void *, size_t, const void *, size_t, const ZSTD_DDict *)"
                   );
    }
    local_80 = local_80 + sStackY_a0;
    bVar9 = true;
  }
LAB_0016f6cf:
  sVar2 = 0xffffffffffffffb8;
  if (!bVar9) {
    sVar2 = sStackY_a0;
  }
  if ((int)sStackY_a0 == -10) {
    return sVar2;
  }
  return sStackY_a0;
}

Assistant:

static size_t ZSTD_decompressMultiFrame(ZSTD_DCtx* dctx,
                                        void* dst, size_t dstCapacity,
                                  const void* src, size_t srcSize,
                                  const void* dict, size_t dictSize,
                                  const ZSTD_DDict* ddict)
{
    void* const dststart = dst;
    int moreThan1Frame = 0;

    DEBUGLOG(5, "ZSTD_decompressMultiFrame");
    assert(dict==NULL || ddict==NULL);  /* either dict or ddict set, not both */

    if (ddict) {
        dict = ZSTD_DDict_dictContent(ddict);
        dictSize = ZSTD_DDict_dictSize(ddict);
    }

    while (srcSize >= ZSTD_startingInputLength(dctx->format)) {

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (ZSTD_isLegacy(src, srcSize)) {
            size_t decodedSize;
            size_t const frameSize = ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
            if (ZSTD_isError(frameSize)) return frameSize;
            RETURN_ERROR_IF(dctx->staticSize, memory_allocation,
                "legacy support is not compatible with static dctx");

            decodedSize = ZSTD_decompressLegacy(dst, dstCapacity, src, frameSize, dict, dictSize);
            if (ZSTD_isError(decodedSize)) return decodedSize;

            assert(decodedSize <= dstCapacity);
            dst = (BYTE*)dst + decodedSize;
            dstCapacity -= decodedSize;

            src = (const BYTE*)src + frameSize;
            srcSize -= frameSize;

            continue;
        }
#endif

        if (srcSize >= 4) {
            U32 const magicNumber = MEM_readLE32(src);
            DEBUGLOG(5, "reading magic number %08X", (unsigned)magicNumber);
            if ((magicNumber & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
                /* skippable frame detected : skip it */
                size_t const skippableSize = readSkippableFrameSize(src, srcSize);
                FORWARD_IF_ERROR(skippableSize, "invalid skippable frame");
                assert(skippableSize <= srcSize);

                src = (const BYTE *)src + skippableSize;
                srcSize -= skippableSize;
                continue; /* check next frame */
        }   }

        if (ddict) {
            /* we were called from ZSTD_decompress_usingDDict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(dctx, ddict), "");
        } else {
            /* this will initialize correctly with no dict if dict == NULL, so
             * use this in all cases but ddict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDict(dctx, dict, dictSize), "");
        }
        ZSTD_checkContinuity(dctx, dst, dstCapacity);

        {   const size_t res = ZSTD_decompressFrame(dctx, dst, dstCapacity,
                                                    &src, &srcSize);
            RETURN_ERROR_IF(
                (ZSTD_getErrorCode(res) == ZSTD_error_prefix_unknown)
             && (moreThan1Frame==1),
                srcSize_wrong,
                "At least one frame successfully completed, "
                "but following bytes are garbage: "
                "it's more likely to be a srcSize error, "
                "specifying more input bytes than size of frame(s). "
                "Note: one could be unlucky, it might be a corruption error instead, "
                "happening right at the place where we expect zstd magic bytes. "
                "But this is _much_ less likely than a srcSize field error.");
            if (ZSTD_isError(res)) return res;
            assert(res <= dstCapacity);
            if (res != 0)
                dst = (BYTE*)dst + res;
            dstCapacity -= res;
        }
        moreThan1Frame = 1;
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    RETURN_ERROR_IF(srcSize, srcSize_wrong, "input not entirely consumed");

    return (size_t)((BYTE*)dst - (BYTE*)dststart);
}